

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

Split * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
          (Split *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  unsigned_long uVar1;
  CentGeomBBox3fa *pCVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  char cVar9;
  uint uVar10;
  size_t sVar11;
  undefined4 uVar12;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar13 [16];
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  SpatialSplit spatial_split;
  ObjectSplit object_split;
  SplitInfo oinfo;
  SpatialSplit local_108;
  ObjectSplit local_b8;
  SplitInfo local_78;
  
  if ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end -
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin < 0xc00) {
    sVar11 = logBlockSize;
    sequential_object_find(&local_b8,this,set,logBlockSize,&local_78);
    uVar12 = (undefined4)sVar11;
  }
  else {
    sVar11 = logBlockSize;
    parallel_object_find(&local_b8,this,set,logBlockSize,&local_78);
    uVar12 = (undefined4)sVar11;
  }
  fVar8 = local_b8.sah;
  uVar1 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  if ((set->super_extended_range<unsigned_long>)._ext_end != uVar1) {
    auVar19 = maxps((undefined1  [16])local_78.leftBounds.lower.field_0,
                    (undefined1  [16])local_78.rightBounds.lower.field_0);
    auVar13 = minps((undefined1  [16])local_78.leftBounds.upper.field_0,
                    (undefined1  [16])local_78.rightBounds.upper.field_0);
    fVar18 = auVar19._0_4_;
    fVar15 = auVar19._4_4_;
    fVar17 = auVar19._8_4_;
    fVar21 = auVar13._0_4_;
    fVar14 = auVar13._4_4_;
    fVar16 = auVar13._8_4_;
    auVar3._4_4_ = -(uint)(fVar15 <= fVar14);
    auVar3._0_4_ = -(uint)(fVar18 <= fVar21);
    auVar3._8_4_ = -(uint)(fVar17 <= fVar16);
    auVar3._12_4_ = -(uint)(auVar19._12_4_ <= auVar13._12_4_);
    uVar10 = movmskps(uVar12,auVar3);
    fVar20 = 0.0;
    fVar22 = 0.0;
    cVar9 = (char)(uVar10 & 0xffffff07);
    if (cVar9 == '\a') {
      fVar22 = ((fVar14 - fVar15) + (fVar16 - fVar17)) * (fVar21 - fVar18) +
               (fVar16 - fVar17) * (fVar14 - fVar15);
      fVar22 = fVar22 + fVar22;
    }
    pCVar2 = this->root_info;
    fVar4 = (pCVar2->geomBounds).lower.field_0.m128[0];
    fVar5 = (pCVar2->geomBounds).lower.field_0.m128[1];
    fVar6 = (pCVar2->geomBounds).lower.field_0.m128[2];
    fVar7 = (pCVar2->geomBounds).upper.field_0.m128[0];
    fVar23 = (pCVar2->geomBounds).upper.field_0.m128[1];
    fVar24 = (pCVar2->geomBounds).upper.field_0.m128[2];
    auVar13._4_4_ = -(uint)(fVar5 <= fVar23);
    auVar13._0_4_ = -(uint)(fVar4 <= fVar7);
    auVar13._8_4_ = -(uint)(fVar6 <= fVar24);
    auVar13._12_4_ =
         -(uint)((pCVar2->geomBounds).lower.field_0.m128[3] <=
                (pCVar2->geomBounds).upper.field_0.m128[3]);
    uVar12 = movmskps((int)pCVar2,auVar13);
    if ((~(byte)uVar12 & 7) == 0) {
      fVar23 = fVar23 - fVar5;
      fVar24 = fVar24 - fVar6;
      fVar20 = (fVar23 + fVar24) * (fVar7 - fVar4) + fVar24 * fVar23;
      fVar20 = (fVar20 + fVar20) * 5e-06;
    }
    if (fVar20 <= fVar22) {
      fVar20 = 0.0;
      fVar22 = 0.0;
      if (cVar9 == '\a') {
        fVar22 = ((fVar14 - fVar15) + (fVar16 - fVar17)) * (fVar21 - fVar18) +
                 (fVar16 - fVar17) * (fVar14 - fVar15);
        fVar22 = fVar22 + fVar22;
      }
      fVar21 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[0];
      fVar14 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[1];
      fVar16 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[2];
      fVar18 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[0];
      fVar15 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[1];
      fVar17 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[2];
      auVar19._4_4_ = -(uint)(fVar14 <= fVar15);
      auVar19._0_4_ = -(uint)(fVar21 <= fVar18);
      auVar19._8_4_ = -(uint)(fVar16 <= fVar17);
      auVar19._12_4_ =
           -(uint)((set->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128[3] <=
                  (set->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128[3]);
      uVar12 = movmskps(uVar10 & 0xffffff07,auVar19);
      if ((~(byte)uVar12 & 7) == 0) {
        fVar15 = fVar15 - fVar14;
        fVar17 = fVar17 - fVar16;
        fVar21 = (fVar15 + fVar17) * (fVar18 - fVar21) + fVar17 * fVar15;
        fVar20 = (fVar21 + fVar21) * 0.1;
      }
      if (fVar20 <= fVar22) {
        if (uVar1 - (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin <
            0xc00) {
          sequential_spatial_find(&local_108,this,set,logBlockSize);
        }
        else {
          parallel_spatial_find(&local_108,this,set,logBlockSize);
        }
        if ((local_108.sah < fVar8 * 0.99) &&
           (uVar1 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end,
           ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin - uVar1) +
           (long)local_108.right + (long)local_108.left <=
           (set->super_extended_range<unsigned_long>)._ext_end - uVar1)) {
          __return_storage_ptr__->spatial = true;
          __return_storage_ptr__->sah = local_108.sah;
          *(ulong *)__return_storage_ptr__->data = CONCAT44(local_108.dim,local_108.sah);
          *(ulong *)(__return_storage_ptr__->data + 8) = CONCAT44(local_108.left,local_108.pos);
          *(ulong *)(__return_storage_ptr__->data + 0x10) =
               CONCAT44(local_108.factor,local_108.right);
          *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_108.mapping.ofs.field_0._0_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_108.mapping.ofs.field_0._8_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x30) =
               local_108.mapping.scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x38) =
               local_108.mapping.scale.field_0._8_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x40) =
               local_108.mapping.inv_scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x48) =
               local_108.mapping.inv_scale.field_0._8_8_;
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->spatial = false;
  __return_storage_ptr__->sah = fVar8;
  *(ulong *)__return_storage_ptr__->data = CONCAT44(local_b8.dim,local_b8.sah);
  *(undefined8 *)(__return_storage_ptr__->data + 8) = local_b8._8_8_;
  *(size_t *)(__return_storage_ptr__->data + 0x10) = local_b8.mapping.num;
  *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_b8.mapping.ofs.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_b8.mapping.ofs.field_0._8_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x30) = local_b8.mapping.scale.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x38) = local_b8.mapping.scale.field_0._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SplitInfo oinfo;
          const ObjectSplit object_split = object_find(set,logBlockSize,oinfo);
          const float object_split_sah = object_split.splitSAH();

          if (unlikely(set.has_ext_range()))
          {
            const BBox3fa overlap = intersect(oinfo.leftBounds, oinfo.rightBounds);
            
            /* do only spatial splits if the child bounds overlap */
            if (safeArea(overlap) >= SPATIAL_ASPLIT_AREA_THRESHOLD*safeArea(root_info.geomBounds) &&
                safeArea(overlap) >= SPATIAL_ASPLIT_OVERLAP_THRESHOLD*safeArea(set.geomBounds))
            {              
              const SpatialSplit spatial_split = spatial_find(set, logBlockSize);
              const float spatial_split_sah = spatial_split.splitSAH();

              /* valid spatial split, better SAH and number of splits do not exceed extended range */
              if (spatial_split_sah < SPATIAL_ASPLIT_SAH_THRESHOLD*object_split_sah &&
                  spatial_split.left + spatial_split.right - set.size() <= set.ext_range_size())
              {          
                return Split(spatial_split,spatial_split_sah);
              }
            }
          }

          return Split(object_split,object_split_sah);
        }